

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

golf_entity_t *
golf_entity_ball_start(golf_entity_t *__return_storage_ptr__,char *name,golf_transform_t transform)

{
  __return_storage_ptr__->active = true;
  __return_storage_ptr__->parent_idx = -1;
  __return_storage_ptr__->type = BALL_START_ENTITY;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name);
  *(undefined8 *)&__return_storage_ptr__->field_4 = transform.position._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 8) = transform._8_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x10) = transform.rotation._4_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x18) = transform._24_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x20) = transform.scale._4_8_;
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_ball_start(const char *name, golf_transform_t transform) {
    golf_entity_t entity;
    entity.active = true;
    entity.parent_idx = -1;
    entity.type = BALL_START_ENTITY;
    snprintf(entity.name, GOLF_MAX_NAME_LEN, "%s", name);
    entity.ball_start.transform = transform;
    return entity;
}